

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O1

Matrix * __thiscall
ConditionalEstimator::getEstimate
          (Matrix *__return_storage_ptr__,ConditionalEstimator *this,Property *p)

{
  _func_int **pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  int iVar4;
  pointer pcVar5;
  StochasticProcess *pSVar6;
  pointer pcVar7;
  bool bVar8;
  uint uVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  long *plVar12;
  size_type *psVar13;
  ulong *puVar14;
  _func_int **pp_Var15;
  int iVar16;
  int i;
  ulong uVar17;
  undefined8 uVar18;
  int i_00;
  long lVar19;
  Graph a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  Matrix *local_748;
  ulong *local_740;
  long local_738;
  ulong local_730 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  double local_6e0;
  double local_6d8;
  undefined1 local_6d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_6b8 [14];
  undefined1 local_5d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_5b8 [14];
  ulong local_4d0;
  double local_4c8;
  undefined1 local_4c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_4a8 [14];
  Physical local_3c0;
  Physical local_328;
  Physical local_290;
  Physical local_1f8;
  Physical local_160;
  Physical local_c8;
  
  uVar9 = (this->super_Estimator).nSamples;
  if (uVar9 == 0) {
    local_6e0 = 1.0;
  }
  else {
    local_6e0 = (double)uVar9;
  }
  if (((this->super_Estimator).nEstimate & 0x40) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"multiplying by dt: ",0x13);
    poVar10 = std::ostream::_M_insert<double>(((this->super_Estimator).estimatorTime)->dt);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    local_6e0 = local_6e0 * ((this->super_Estimator).estimatorTime)->dt;
  }
  uVar9 = (this->super_Estimator).nEstimate & *p;
  local_748 = __return_storage_ptr__;
  if ((uVar9 & 1) == 0) {
    if ((uVar9 & 4) == 0) {
      if ((uVar9 & 0x20) != 0) {
        Matrix::Matrix((Matrix *)local_4c0,this->nPre + this->nPost + 1,2);
        local_4c0._0_8_ = &PTR__Matrix_0015c7e8;
        pcVar7 = local_6d0 + 0x10;
        local_6d0._0_8_ = pcVar7;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6d0,"conditional auto-correlation","");
        Matrix::setName((Matrix *)local_4c0,(string *)local_6d0);
        if ((pointer)local_6d0._0_8_ != pcVar7) {
          operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
        }
        pSVar6 = (this->super_Estimator).pSource;
        if (pSVar6 != (StochasticProcess *)0x0) {
          pcVar5 = (pSVar6->super_Parametric).parametricName._M_dataplus._M_p;
          local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_700,pcVar5,
                     pcVar5 + (pSVar6->super_Parametric).parametricName._M_string_length);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,0x14d08a);
          psVar13 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_720.field_2._M_allocated_capacity = *psVar13;
            local_720.field_2._8_8_ = plVar12[3];
            local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
          }
          else {
            local_720.field_2._M_allocated_capacity = *psVar13;
            local_720._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_720._M_string_length = plVar12[1];
          *plVar12 = (long)psVar13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_720);
          paVar2 = &local_768.field_2;
          puVar14 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_768.field_2._M_allocated_capacity = *puVar14;
            local_768.field_2._8_4_ = (undefined4)plVar12[3];
            local_768.field_2._12_4_ = *(undefined4 *)((long)plVar12 + 0x1c);
            local_768._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_768.field_2._M_allocated_capacity = *puVar14;
            local_768._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_768._M_string_length = plVar12[1];
          *plVar12 = (long)puVar14;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          pSVar6 = (this->super_Estimator).pSource;
          pcVar5 = (pSVar6->super_Parametric).parametricType._M_dataplus._M_p;
          local_740 = local_730;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_740,pcVar5,
                     pcVar5 + (pSVar6->super_Parametric).parametricType._M_string_length);
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_768._M_dataplus._M_p != paVar2) {
            uVar18 = local_768.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_738 + local_768._M_string_length) {
            uVar17 = 0xf;
            if (local_740 != local_730) {
              uVar17 = local_730[0];
            }
            if (uVar17 < local_738 + local_768._M_string_length) goto LAB_00123e2c;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_740,0,(char *)0x0,(ulong)local_768._M_dataplus._M_p);
          }
          else {
LAB_00123e2c:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_768,(ulong)local_740);
          }
          local_5d0._0_8_ = local_5d0 + 0x10;
          pp_Var1 = (_func_int **)(puVar11 + 2);
          if ((_func_int **)*puVar11 == pp_Var1) {
            local_5d0._16_8_ = *pp_Var1;
            aaStack_5b8[0]._0_8_ = puVar11[3];
          }
          else {
            local_5d0._16_8_ = *pp_Var1;
            local_5d0._0_8_ = (_func_int **)*puVar11;
          }
          local_5d0._8_8_ = puVar11[1];
          *puVar11 = pp_Var1;
          puVar11[1] = 0;
          *(undefined1 *)pp_Var1 = 0;
          plVar12 = (long *)std::__cxx11::string::append(local_5d0);
          psVar13 = (size_type *)(plVar12 + 2);
          if ((size_type *)*plVar12 == psVar13) {
            local_6d0._16_8_ = *psVar13;
            aaStack_6b8[0]._0_8_ = plVar12[3];
            local_6d0._0_8_ = pcVar7;
          }
          else {
            local_6d0._16_8_ = *psVar13;
            local_6d0._0_8_ = (size_type *)*plVar12;
          }
          local_6d0._8_8_ = plVar12[1];
          *plVar12 = (long)psVar13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          Matrix::setName((Matrix *)local_4c0,(string *)local_6d0);
          if ((pointer)local_6d0._0_8_ != pcVar7) {
            operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
          }
          if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
            operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
          }
          if (local_740 != local_730) {
            operator_delete(local_740,local_730[0] + 1);
          }
          __return_storage_ptr__ = local_748;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_768._M_dataplus._M_p != paVar2) {
            operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_720._M_dataplus._M_p != &local_720.field_2) {
            operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_dataplus._M_p != &local_700.field_2) {
            operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
          }
        }
        uVar17 = (ulong)(uint)this->nPre;
        if (-1 < this->nPost + this->nPre) {
          lVar19 = 0;
          do {
            iVar16 = (int)lVar19;
            dVar3 = ((this->super_Estimator).estimatorTime)->dt;
            Matrix::operator[]((Matrix *)local_5d0,(Matrix *)local_4c0,iVar16);
            Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,0);
            Matrix::operator=((Matrix *)local_6d0,
                              (((double)iVar16 - (double)(int)uVar17) + 1.0) * dVar3);
            Matrix::~Matrix((Matrix *)local_6d0);
            Matrix::~Matrix((Matrix *)local_5d0);
            dVar3 = this->aEvents[lVar19];
            Matrix::operator[]((Matrix *)local_5d0,(Matrix *)local_4c0,iVar16);
            Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,1);
            Matrix::operator=((Matrix *)local_6d0,dVar3 / local_6e0);
            Matrix::~Matrix((Matrix *)local_6d0);
            Matrix::~Matrix((Matrix *)local_5d0);
            uVar17 = (ulong)this->nPre;
            bVar8 = lVar19 < (long)((long)this->nPost + uVar17);
            lVar19 = lVar19 + 1;
          } while (bVar8);
        }
        Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_4c0);
        goto LAB_00124484;
      }
      if ((uVar9 & 8) == 0) {
        if ((uVar9 & 2) == 0) {
          Matrix::Matrix(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        iVar16 = this->nPre;
        iVar4 = this->nPost;
        Matrix::Matrix(__return_storage_ptr__,iVar4 + iVar16 + 1,this->nDist,3);
        pp_Var1 = (_func_int **)(local_4c0 + 0x10);
        local_4c0._0_8_ = pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4c0,"conditional density","");
        Matrix::setName(__return_storage_ptr__,(string *)local_4c0);
        if ((_func_int **)local_4c0._0_8_ != pp_Var1) {
          operator_delete((void *)local_4c0._0_8_,(ulong)(local_4c0._16_8_ + 1));
        }
        pSVar6 = (this->super_Estimator).pSource;
        if (pSVar6 != (StochasticProcess *)0x0) {
          pcVar7 = (pSVar6->super_Parametric).parametricName._M_dataplus._M_p;
          local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_720,pcVar7,
                     pcVar7 + (pSVar6->super_Parametric).parametricName._M_string_length);
          std::operator+(&local_768,"conditional density of ",&local_720);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_768);
          pp_Var15 = (_func_int **)(puVar11 + 2);
          if ((_func_int **)*puVar11 == pp_Var15) {
            local_5d0._16_8_ = *pp_Var15;
            aaStack_5b8[0]._0_8_ = puVar11[3];
            local_5d0._0_8_ = local_5d0 + 0x10;
          }
          else {
            local_5d0._16_8_ = *pp_Var15;
            local_5d0._0_8_ = (_func_int **)*puVar11;
          }
          local_5d0._8_8_ = puVar11[1];
          *puVar11 = pp_Var15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          pSVar6 = (this->super_Estimator).pSource;
          pcVar7 = (pSVar6->super_Parametric).parametricType._M_dataplus._M_p;
          local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_700,pcVar7,
                     pcVar7 + (pSVar6->super_Parametric).parametricType._M_string_length);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_6d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5d0,&local_700);
          plVar12 = (long *)std::__cxx11::string::append(local_6d0);
          pp_Var15 = (_func_int **)(plVar12 + 2);
          if ((_func_int **)*plVar12 == pp_Var15) {
            local_4c0._16_8_ = *pp_Var15;
            aaStack_4a8[0]._0_8_ = plVar12[3];
            local_4c0._0_8_ = pp_Var1;
          }
          else {
            local_4c0._16_8_ = *pp_Var15;
            local_4c0._0_8_ = (_func_int **)*plVar12;
          }
          local_4c0._8_8_ = plVar12[1];
          *plVar12 = (long)pp_Var15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          Matrix::setName(local_748,(string *)local_4c0);
          if ((_func_int **)local_4c0._0_8_ != pp_Var1) {
            operator_delete((void *)local_4c0._0_8_,(ulong)(local_4c0._16_8_ + 1));
          }
          if ((undefined1 *)local_6d0._0_8_ != local_6d0 + 0x10) {
            operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_dataplus._M_p != &local_700.field_2) {
            operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
            operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_768._M_dataplus._M_p != &local_768.field_2) {
            operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_720._M_dataplus._M_p != &local_720.field_2) {
            operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
          }
        }
        if (this->nDist < 1) {
          return local_748;
        }
        local_4d0 = (ulong)(uint)(iVar4 + iVar16);
        lVar19 = 0;
        do {
          if (-1 < (int)local_4d0) {
            i_00 = (int)lVar19;
            local_4c8 = (double)i_00;
            uVar17 = 0;
            do {
              i = (int)uVar17;
              local_6d8 = ((double)i - (double)this->nPre) *
                          ((this->super_Estimator).estimatorTime)->dt;
              Matrix::operator[]((Matrix *)local_5d0,local_748,i);
              Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,i_00);
              Matrix::operator[]((Matrix *)local_4c0,(Matrix *)local_6d0,0);
              Matrix::operator=((Matrix *)local_4c0,local_6d8);
              Matrix::~Matrix((Matrix *)local_4c0);
              Matrix::~Matrix((Matrix *)local_6d0);
              Matrix::~Matrix((Matrix *)local_5d0);
              local_6d8 = this->dDistScale * local_4c8 + this->dDistOffset;
              Matrix::operator[]((Matrix *)local_5d0,local_748,i);
              Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,i_00);
              Matrix::operator[]((Matrix *)local_4c0,(Matrix *)local_6d0,1);
              Matrix::operator=((Matrix *)local_4c0,local_6d8);
              Matrix::~Matrix((Matrix *)local_4c0);
              Matrix::~Matrix((Matrix *)local_6d0);
              Matrix::~Matrix((Matrix *)local_5d0);
              local_6d8 = this->aDist[uVar17][lVar19];
              Matrix::operator[]((Matrix *)local_5d0,local_748,i);
              Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,i_00);
              Matrix::operator[]((Matrix *)local_4c0,(Matrix *)local_6d0,2);
              Matrix::operator=((Matrix *)local_4c0,local_6d8 / local_6e0);
              Matrix::~Matrix((Matrix *)local_4c0);
              Matrix::~Matrix((Matrix *)local_6d0);
              Matrix::~Matrix((Matrix *)local_5d0);
              uVar17 = uVar17 + 1;
            } while (iVar16 + iVar4 + 1 != uVar17);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < this->nDist);
        return local_748;
      }
      Matrix::Matrix((Matrix *)local_4c0,this->nPre + this->nPost + 1,2);
      local_4c0._0_8_ = &PTR__Matrix_0015c7e8;
      pcVar7 = local_6d0 + 0x10;
      local_6d0._0_8_ = pcVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"conditional variance","")
      ;
      Matrix::setName((Matrix *)local_4c0,(string *)local_6d0);
      if ((pointer)local_6d0._0_8_ != pcVar7) {
        operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
      }
      pSVar6 = (this->super_Estimator).pSource;
      if (pSVar6 != (StochasticProcess *)0x0) {
        pcVar5 = (pSVar6->super_Parametric).parametricName._M_dataplus._M_p;
        local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_700,pcVar5,
                   pcVar5 + (pSVar6->super_Parametric).parametricName._M_string_length);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,0x14d0c0);
        psVar13 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_720.field_2._M_allocated_capacity = *psVar13;
          local_720.field_2._8_8_ = plVar12[3];
          local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
        }
        else {
          local_720.field_2._M_allocated_capacity = *psVar13;
          local_720._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_720._M_string_length = plVar12[1];
        *plVar12 = (long)psVar13;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_720);
        paVar2 = &local_768.field_2;
        puVar14 = (ulong *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_768.field_2._M_allocated_capacity = *puVar14;
          local_768.field_2._8_4_ = (undefined4)plVar12[3];
          local_768.field_2._12_4_ = *(undefined4 *)((long)plVar12 + 0x1c);
          local_768._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_768.field_2._M_allocated_capacity = *puVar14;
          local_768._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_768._M_string_length = plVar12[1];
        *plVar12 = (long)puVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        pSVar6 = (this->super_Estimator).pSource;
        pcVar5 = (pSVar6->super_Parametric).parametricType._M_dataplus._M_p;
        local_740 = local_730;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_740,pcVar5,
                   pcVar5 + (pSVar6->super_Parametric).parametricType._M_string_length);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != paVar2) {
          uVar18 = local_768.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_738 + local_768._M_string_length) {
          uVar17 = 0xf;
          if (local_740 != local_730) {
            uVar17 = local_730[0];
          }
          if (uVar17 < local_738 + local_768._M_string_length) goto LAB_001241b4;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_740,0,(char *)0x0,(ulong)local_768._M_dataplus._M_p);
        }
        else {
LAB_001241b4:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_768,(ulong)local_740);
        }
        local_5d0._0_8_ = local_5d0 + 0x10;
        pp_Var1 = (_func_int **)(puVar11 + 2);
        if ((_func_int **)*puVar11 == pp_Var1) {
          local_5d0._16_8_ = *pp_Var1;
          aaStack_5b8[0]._0_8_ = puVar11[3];
        }
        else {
          local_5d0._16_8_ = *pp_Var1;
          local_5d0._0_8_ = (_func_int **)*puVar11;
        }
        local_5d0._8_8_ = puVar11[1];
        *puVar11 = pp_Var1;
        puVar11[1] = 0;
        *(undefined1 *)pp_Var1 = 0;
        plVar12 = (long *)std::__cxx11::string::append(local_5d0);
        psVar13 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar13) {
          local_6d0._16_8_ = *psVar13;
          aaStack_6b8[0]._0_8_ = plVar12[3];
          local_6d0._0_8_ = pcVar7;
        }
        else {
          local_6d0._16_8_ = *psVar13;
          local_6d0._0_8_ = (size_type *)*plVar12;
        }
        local_6d0._8_8_ = plVar12[1];
        *plVar12 = (long)psVar13;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        Matrix::setName((Matrix *)local_4c0,(string *)local_6d0);
        if ((pointer)local_6d0._0_8_ != pcVar7) {
          operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
        }
        if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
          operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
        }
        if (local_740 != local_730) {
          operator_delete(local_740,local_730[0] + 1);
        }
        __return_storage_ptr__ = local_748;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != paVar2) {
          operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p != &local_720.field_2) {
          operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700._M_dataplus._M_p != &local_700.field_2) {
          operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
        }
      }
      uVar17 = (ulong)(uint)this->nPre;
      if (-1 < this->nPost + this->nPre) {
        lVar19 = 0;
        do {
          iVar16 = (int)lVar19;
          dVar3 = ((this->super_Estimator).estimatorTime)->dt;
          Matrix::operator[]((Matrix *)local_5d0,(Matrix *)local_4c0,iVar16);
          Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,0);
          Matrix::operator=((Matrix *)local_6d0,((double)iVar16 - (double)(int)uVar17) * dVar3);
          Matrix::~Matrix((Matrix *)local_6d0);
          Matrix::~Matrix((Matrix *)local_5d0);
          local_6d8 = this->aOne[lVar19];
          dVar3 = this->aTwo[lVar19];
          Matrix::operator[]((Matrix *)local_5d0,(Matrix *)local_4c0,iVar16);
          Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,1);
          Matrix::operator=((Matrix *)local_6d0,
                            dVar3 / local_6e0 - (local_6d8 / local_6e0) * (local_6d8 / local_6e0));
          Matrix::~Matrix((Matrix *)local_6d0);
          Matrix::~Matrix((Matrix *)local_5d0);
          uVar17 = (ulong)this->nPre;
          bVar8 = lVar19 < (long)((long)this->nPost + uVar17);
          lVar19 = lVar19 + 1;
        } while (bVar8);
      }
      Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_4c0);
      goto LAB_00124484;
    }
    Matrix::Matrix((Matrix *)local_4c0,this->nPre + this->nPost + 1,2);
    local_4c0._0_8_ = &PTR__Matrix_0015c7e8;
    pcVar7 = local_6d0 + 0x10;
    local_6d0._0_8_ = pcVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"conditional mean","");
    Matrix::setName((Matrix *)local_4c0,(string *)local_6d0);
    if ((pointer)local_6d0._0_8_ != pcVar7) {
      operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
    }
    pSVar6 = (this->super_Estimator).pSource;
    if (pSVar6 != (StochasticProcess *)0x0) {
      pcVar5 = (pSVar6->super_Parametric).parametricName._M_dataplus._M_p;
      local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_700,pcVar5,
                 pcVar5 + (pSVar6->super_Parametric).parametricName._M_string_length);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,0x14d058);
      psVar13 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_720.field_2._M_allocated_capacity = *psVar13;
        local_720.field_2._8_8_ = plVar12[3];
        local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      }
      else {
        local_720.field_2._M_allocated_capacity = *psVar13;
        local_720._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_720._M_string_length = plVar12[1];
      *plVar12 = (long)psVar13;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_720);
      paVar2 = &local_768.field_2;
      puVar14 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_768.field_2._M_allocated_capacity = *puVar14;
        local_768.field_2._8_4_ = (undefined4)plVar12[3];
        local_768.field_2._12_4_ = *(undefined4 *)((long)plVar12 + 0x1c);
        local_768._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_768.field_2._M_allocated_capacity = *puVar14;
        local_768._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_768._M_string_length = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pSVar6 = (this->super_Estimator).pSource;
      pcVar5 = (pSVar6->super_Parametric).parametricType._M_dataplus._M_p;
      local_740 = local_730;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_740,pcVar5,
                 pcVar5 + (pSVar6->super_Parametric).parametricType._M_string_length);
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != paVar2) {
        uVar18 = local_768.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_738 + local_768._M_string_length) {
        uVar17 = 0xf;
        if (local_740 != local_730) {
          uVar17 = local_730[0];
        }
        if (uVar17 < local_738 + local_768._M_string_length) goto LAB_001238fd;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_740,0,(char *)0x0,(ulong)local_768._M_dataplus._M_p);
      }
      else {
LAB_001238fd:
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_768,(ulong)local_740)
        ;
      }
      local_5d0._0_8_ = local_5d0 + 0x10;
      pp_Var1 = (_func_int **)(puVar11 + 2);
      if ((_func_int **)*puVar11 == pp_Var1) {
        local_5d0._16_8_ = *pp_Var1;
        aaStack_5b8[0]._0_8_ = puVar11[3];
      }
      else {
        local_5d0._16_8_ = *pp_Var1;
        local_5d0._0_8_ = (_func_int **)*puVar11;
      }
      local_5d0._8_8_ = puVar11[1];
      *puVar11 = pp_Var1;
      puVar11[1] = 0;
      *(undefined1 *)pp_Var1 = 0;
      plVar12 = (long *)std::__cxx11::string::append(local_5d0);
      psVar13 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar13) {
        local_6d0._16_8_ = *psVar13;
        aaStack_6b8[0]._0_8_ = plVar12[3];
        local_6d0._0_8_ = pcVar7;
      }
      else {
        local_6d0._16_8_ = *psVar13;
        local_6d0._0_8_ = (size_type *)*plVar12;
      }
      local_6d0._8_8_ = plVar12[1];
      *plVar12 = (long)psVar13;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      Matrix::setName((Matrix *)local_4c0,(string *)local_6d0);
      if ((pointer)local_6d0._0_8_ != pcVar7) {
        operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
      }
      if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
        operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
      }
      if (local_740 != local_730) {
        operator_delete(local_740,local_730[0] + 1);
      }
      __return_storage_ptr__ = local_748;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != paVar2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_700._M_dataplus._M_p != &local_700.field_2) {
        operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
      }
      Physical::Physical(&local_290,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical((Matrix *)local_4c0,&local_290);
      Physical::~Physical(&local_290);
      Physical::Physical(&local_328,&((this->super_Estimator).estimatorTime)->super_Physical);
      Matrix::setPhysical((Matrix *)local_4c0,0,&local_328);
      Physical::~Physical(&local_328);
      Physical::Physical(&local_3c0,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical((Matrix *)local_4c0,1,&local_3c0);
      Physical::~Physical(&local_3c0);
    }
    uVar17 = (ulong)(uint)this->nPre;
    if (-1 < this->nPost + this->nPre) {
      lVar19 = 0;
      do {
        iVar16 = (int)lVar19;
        dVar3 = ((this->super_Estimator).estimatorTime)->dt;
        Matrix::operator[]((Matrix *)local_5d0,(Matrix *)local_4c0,iVar16);
        Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,0);
        Matrix::operator=((Matrix *)local_6d0,((double)iVar16 - (double)(int)uVar17) * dVar3);
        Matrix::~Matrix((Matrix *)local_6d0);
        Matrix::~Matrix((Matrix *)local_5d0);
        dVar3 = this->aOne[lVar19];
        Matrix::operator[]((Matrix *)local_5d0,(Matrix *)local_4c0,iVar16);
        Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,1);
        Matrix::operator=((Matrix *)local_6d0,dVar3 / local_6e0);
        Matrix::~Matrix((Matrix *)local_6d0);
        Matrix::~Matrix((Matrix *)local_5d0);
        uVar17 = (ulong)this->nPre;
        bVar8 = lVar19 < (long)((long)this->nPost + uVar17);
        lVar19 = lVar19 + 1;
      } while (bVar8);
    }
    Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_4c0);
    goto LAB_00124484;
  }
  Matrix::Matrix((Matrix *)local_4c0,this->nPre + this->nPost + 1,2);
  local_4c0._0_8_ = &PTR__Matrix_0015c7e8;
  pcVar7 = local_6d0 + 0x10;
  local_6d0._0_8_ = pcVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"sample","");
  Matrix::setName((Matrix *)local_4c0,(string *)local_6d0);
  if ((pointer)local_6d0._0_8_ != pcVar7) {
    operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
  }
  pSVar6 = (this->super_Estimator).pSource;
  if (pSVar6 != (StochasticProcess *)0x0) {
    pcVar5 = (pSVar6->super_Parametric).parametricName._M_dataplus._M_p;
    local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_700,pcVar5,
               pcVar5 + (pSVar6->super_Parametric).parametricName._M_string_length);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,0x14d02e);
    psVar13 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_720.field_2._M_allocated_capacity = *psVar13;
      local_720.field_2._8_8_ = plVar12[3];
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
    }
    else {
      local_720.field_2._M_allocated_capacity = *psVar13;
      local_720._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_720._M_string_length = plVar12[1];
    *plVar12 = (long)psVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_720);
    paVar2 = &local_768.field_2;
    puVar14 = (ulong *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_768.field_2._M_allocated_capacity = *puVar14;
      local_768.field_2._8_4_ = (undefined4)plVar12[3];
      local_768.field_2._12_4_ = *(undefined4 *)((long)plVar12 + 0x1c);
      local_768._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_768.field_2._M_allocated_capacity = *puVar14;
      local_768._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_768._M_string_length = plVar12[1];
    *plVar12 = (long)puVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pSVar6 = (this->super_Estimator).pSource;
    pcVar5 = (pSVar6->super_Parametric).parametricType._M_dataplus._M_p;
    local_740 = local_730;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_740,pcVar5,
               pcVar5 + (pSVar6->super_Parametric).parametricType._M_string_length);
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_768._M_dataplus._M_p != paVar2) {
      uVar18 = local_768.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_738 + local_768._M_string_length) {
      uVar17 = 0xf;
      if (local_740 != local_730) {
        uVar17 = local_730[0];
      }
      if (uVar17 < local_738 + local_768._M_string_length) goto LAB_001233d9;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_740,0,(char *)0x0,(ulong)local_768._M_dataplus._M_p);
    }
    else {
LAB_001233d9:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_768,(ulong)local_740);
    }
    local_5d0._0_8_ = local_5d0 + 0x10;
    pp_Var1 = (_func_int **)(puVar11 + 2);
    if ((_func_int **)*puVar11 == pp_Var1) {
      local_5d0._16_8_ = *pp_Var1;
      aaStack_5b8[0]._0_8_ = puVar11[3];
    }
    else {
      local_5d0._16_8_ = *pp_Var1;
      local_5d0._0_8_ = (_func_int **)*puVar11;
    }
    local_5d0._8_8_ = puVar11[1];
    *puVar11 = pp_Var1;
    puVar11[1] = 0;
    *(undefined1 *)pp_Var1 = 0;
    plVar12 = (long *)std::__cxx11::string::append(local_5d0);
    psVar13 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar13) {
      local_6d0._16_8_ = *psVar13;
      aaStack_6b8[0]._0_8_ = plVar12[3];
      local_6d0._0_8_ = pcVar7;
    }
    else {
      local_6d0._16_8_ = *psVar13;
      local_6d0._0_8_ = (size_type *)*plVar12;
    }
    local_6d0._8_8_ = plVar12[1];
    *plVar12 = (long)psVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    Matrix::setName((Matrix *)local_4c0,(string *)local_6d0);
    if ((pointer)local_6d0._0_8_ != pcVar7) {
      operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
    }
    if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if (local_740 != local_730) {
      operator_delete(local_740,local_730[0] + 1);
    }
    __return_storage_ptr__ = local_748;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_768._M_dataplus._M_p != paVar2) {
      operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p != &local_720.field_2) {
      operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700._M_dataplus._M_p != &local_700.field_2) {
      operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
    }
    Physical::Physical(&local_c8,&((this->super_Estimator).pSource)->super_Physical);
    Matrix::setPhysical((Matrix *)local_4c0,&local_c8);
    Physical::~Physical(&local_c8);
    Physical::Physical(&local_160,&((this->super_Estimator).estimatorTime)->super_Physical);
    Matrix::setPhysical((Matrix *)local_4c0,0,&local_160);
    Physical::~Physical(&local_160);
    Physical::Physical(&local_1f8,&((this->super_Estimator).pSource)->super_Physical);
    Matrix::setPhysical((Matrix *)local_4c0,1,&local_1f8);
    Physical::~Physical(&local_1f8);
  }
  uVar17 = (ulong)(uint)this->nPre;
  if (-1 < this->nPost + this->nPre) {
    lVar19 = 0;
    do {
      iVar16 = (int)lVar19;
      dVar3 = ((this->super_Estimator).estimatorTime)->dt;
      Matrix::operator[]((Matrix *)local_5d0,(Matrix *)local_4c0,iVar16);
      Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,0);
      Matrix::operator=((Matrix *)local_6d0,((double)iVar16 - (double)(int)uVar17) * dVar3);
      Matrix::~Matrix((Matrix *)local_6d0);
      Matrix::~Matrix((Matrix *)local_5d0);
      dVar3 = this->condSamples[lVar19];
      Matrix::operator[]((Matrix *)local_5d0,(Matrix *)local_4c0,iVar16);
      Matrix::operator[]((Matrix *)local_6d0,(Matrix *)local_5d0,1);
      Matrix::operator=((Matrix *)local_6d0,dVar3);
      Matrix::~Matrix((Matrix *)local_6d0);
      Matrix::~Matrix((Matrix *)local_5d0);
      uVar17 = (ulong)this->nPre;
      bVar8 = lVar19 < (long)((long)this->nPost + uVar17);
      lVar19 = lVar19 + 1;
    } while (bVar8);
  }
  Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_4c0);
LAB_00124484:
  Matrix::~Matrix((Matrix *)local_4c0);
  return local_748;
}

Assistant:

Matrix ConditionalEstimator::getEstimate(const Property& p)
{
	double samples = (nSamples!=0.0)? double(nSamples): 1.0;
	if(nEstimate & EST_DIFF) {
		cout << "multiplying by dt: " << estimatorTime->dt << endl;
		samples *= estimatorTime->dt;
	}
	if(p & nEstimate & EST_SAMPLE) {
		Graph a(nPre+nPost+1);
		a.setName("sample");
		if( pSource ) {
			a.setName( "conditional sample of " + pSource->getName() + " (" + pSource->getType() + ")");
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre);
			a[i][1] = condSamples[i];
		}
		return a;
	}		
	if(p & nEstimate & EST_MEAN) {
		Graph a(nPre+nPost+1);
		a.setName("conditional mean");
		if( pSource ) {
			a.setName( "conditional mean of " + pSource->getName() + " (" + pSource->getType() + ")");
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre);
			a[i][1] = aOne[i] / samples;
		}
		return a;
	}
	if(p & nEstimate & EST_EVENTS) {
		Graph a(nPre+nPost+1);
		a.setName("conditional auto-correlation");
		if (pSource)
			a.setName("conditional auto-correlation of " + pSource->getName() + " (" + pSource->getType() + ")");
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre + 1);
			a[i][1] = aEvents[i] / samples;
		}
		return a;
	}
	else if(p & nEstimate & EST_VAR) {
		Graph a(nPre+nPost+1);
		a.setName("conditional variance");
		if (pSource)
			a.setName("conditional variance of " + pSource->getName() + " (" + pSource->getType() + ")");
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre);
			double mean = aOne[i] / samples;
			a[i][1] = (aTwo[i] / samples - mean*mean);
		}
		return a;
	}
	else if( p & nEstimate & EST_DENS ) {
		int timeSize = nPre+nPost+1;
		Matrix a(timeSize, nDist, 3);
		a.setName("conditional density");
		if (pSource)
			a.setName("conditional density of " + pSource->getName() + " (" + pSource->getType() + ")");
		for(int j=0; j<nDist; j++)
			for( int i=0; i<timeSize; i++ ) {
				a[i][j][0] = estimatorTime->dt * ((double) i - nPre);
				a[i][j][1] = (double(j) * dDistScale) + dDistOffset;
				a[i][j][2] = aDist[i][j] / samples;
			}
		return a;
	}
	return Matrix();
}